

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Iiff(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fUseLuts;
  Gia_Man_t *pNew;
  uint fUseGates;
  char *pcVar2;
  uint fUseCells;
  char *pcVar3;
  int iVar4;
  uint fVerbose;
  uint local_48;
  uint local_44;
  
  fUseGates = 0;
  Extra_UtilGetoptReset();
  local_44 = 0xc;
  local_48 = 8;
  fUseCells = 0;
  fUseLuts = 0;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"KCgclvh"), iVar4 = globalUtilOptind, iVar1 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 < 99) break;
      if (iVar1 == 99) {
        fUseCells = fUseCells ^ 1;
      }
      else if (iVar1 == 0x67) {
        fUseGates = fUseGates ^ 1;
      }
      else {
        if (iVar1 != 0x6c) goto LAB_00282dc6;
        fUseLuts = fUseLuts ^ 1;
      }
    }
    if (iVar1 == -1) {
      if (globalUtilOptind + 1 == argc) {
        pcVar3 = argv[globalUtilOptind];
      }
      else {
        pcVar3 = (char *)0x0;
      }
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        pcVar3 = "Abc_CommandAbc9Iiff(): There is no AIG to map.\n";
      }
      else {
        pNew = Gia_ManIiffTest(pcVar3,pAbc->pGia,local_48,local_44,fUseGates,fUseCells,fUseLuts,
                               fVerbose);
        if (pNew != (Gia_Man_t *)0x0) {
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9Iiff(): Mapping has failed.\n";
      }
      iVar4 = -1;
      goto LAB_00282ebb;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-C\" should be followed by a positive integer.\n";
        goto LAB_00282dba;
      }
      local_44 = atoi(argv[globalUtilOptind]);
    }
    else {
      if (iVar1 != 0x4b) goto LAB_00282dc6;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-K\" should be followed by a positive integer.\n";
LAB_00282dba:
        Abc_Print(-1,pcVar3);
LAB_00282dc6:
        Abc_Print(-2,"usage: &iiff [-KC num] [-gclvh] <file>\n");
        Abc_Print(-2,"\t           performs techology mapping\n");
        Abc_Print(-2,"\t-K num   : the maximum LUT size [default = %d]\n",(ulong)local_48);
        Abc_Print(-2,"\t-C num   : the maximum cut count [default = %d]\n",(ulong)local_44);
        pcVar2 = "yes";
        pcVar3 = "yes";
        if (fUseGates == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-g       : toggle using gates [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fUseCells == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-c       : toggle using cells [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fUseLuts == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-l       : toggle using LUTs  [default = %s]\n",pcVar3);
        if (fVerbose == 0) {
          pcVar2 = "no";
        }
        Abc_Print(-2,"\t-v       : toggle verbose output [default = %s]\n",pcVar2);
        Abc_Print(-2,"\t-h       : print the command usage\n");
        pcVar3 = "\t<file>   : (optional) output file name\n";
        iVar4 = -2;
LAB_00282ebb:
        Abc_Print(iVar4,pcVar3);
        return 1;
      }
      local_48 = atoi(argv[globalUtilOptind]);
    }
    globalUtilOptind = iVar4 + 1;
  } while( true );
}

Assistant:

int Abc_CommandAbc9Iiff( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManIiffTest( char * pFileName, Gia_Man_t * pGia, int nLutSize, int nNumCuts, int fUseGates, int fUseCells, int fUseLuts, int fVerbose );
    char * pFileName = NULL;
    int nLutSize     =  8;
    int nNumCuts     = 12;
    int fUseGates    =  0;
    int fUseCells    =  0;
    int fUseLuts     =  0;
    int c, fVerbose  =  0;
    Gia_Man_t * pNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCgclvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nNumCuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'g':
            fUseGates ^= 1;
            break;
        case 'c':
            fUseCells ^= 1;
            break;
        case 'l':
            fUseLuts ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iiff(): There is no AIG to map.\n" );
        return 1;
    }
    pNew = Gia_ManIiffTest( pFileName, pAbc->pGia, nLutSize, nNumCuts, fUseGates, fUseCells, fUseLuts, fVerbose );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iiff(): Mapping has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    Abc_Print( -2, "usage: &iiff [-KC num] [-gclvh] <file>\n" );
    Abc_Print( -2, "\t           performs techology mapping\n" );
    Abc_Print( -2, "\t-K num   : the maximum LUT size [default = %d]\n",  nLutSize );
    Abc_Print( -2, "\t-C num   : the maximum cut count [default = %d]\n", nNumCuts );
    Abc_Print( -2, "\t-g       : toggle using gates [default = %s]\n",    fUseGates? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle using cells [default = %s]\n",    fUseCells? "yes": "no" );
    Abc_Print( -2, "\t-l       : toggle using LUTs  [default = %s]\n",    fUseLuts? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<file>   : (optional) output file name\n");
    return 1;
}